

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>::
emplaceRealloc<slang::ast::StructuredAssignmentPatternExpression::TypeSetter>
          (SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter> *this,
          pointer pos,TypeSetter *args)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator pTVar3;
  TypeSetter *__result;
  TypeSetter *pTVar4;
  iterator __first;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  TypeSetter *args_local;
  pointer pos_local;
  SmallVectorBase<slang::ast::StructuredAssignmentPatternExpression::TypeSetter> *this_local;
  
  sVar1 = this->len;
  sVar2 = max_size(this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = calculateGrowth(this,this->len + 1);
  pTVar3 = begin(this);
  __result = (TypeSetter *)slang::detail::allocArray(capacity,0x10);
  pTVar4 = __result + ((long)pos - (long)pTVar3 >> 4);
  (pTVar4->type).ptr = (args->type).ptr;
  (pTVar4->expr).ptr = (args->expr).ptr;
  pTVar3 = end(this);
  if (pos == pTVar3) {
    __first = begin(this);
    pTVar3 = end(this);
    std::
    uninitialized_move<slang::ast::StructuredAssignmentPatternExpression::TypeSetter*,slang::ast::StructuredAssignmentPatternExpression::TypeSetter*>
              (__first,pTVar3,__result);
  }
  else {
    pTVar3 = begin(this);
    std::
    uninitialized_move<slang::ast::StructuredAssignmentPatternExpression::TypeSetter*,slang::ast::StructuredAssignmentPatternExpression::TypeSetter*>
              (pTVar3,pos,__result);
    pTVar3 = end(this);
    std::
    uninitialized_move<slang::ast::StructuredAssignmentPatternExpression::TypeSetter*,slang::ast::StructuredAssignmentPatternExpression::TypeSetter*>
              (pos,pTVar3,pTVar4 + 1);
  }
  cleanup(this,(EVP_PKEY_CTX *)pTVar3);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = __result;
  return pTVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}